

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O1

int tnt_iter_map_next(tnt_iter *i)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  char **ppcVar8;
  long lVar9;
  
  uVar5 = (i->data).map.cur_index + 1;
  (i->data).map.cur_index = uVar5;
  if (uVar5 < (i->data).map.pair_count) {
    pcVar2 = *(char **)((long)&i->data + (ulong)(uVar5 != 0) * 0x20 + 8);
    (i->data).array.elem = pcVar2;
    ppcVar8 = &(i->data).array.elem_end;
    (i->data).array.elem_end = pcVar2;
    lVar9 = 1;
    do {
      pbVar3 = (byte *)*ppcVar8;
      bVar1 = *pbVar3;
      *ppcVar8 = (char *)(pbVar3 + 1);
      lVar7 = (long)""[bVar1];
      if (lVar7 < 0) {
        if (bVar1 == 0xd9) {
          *ppcVar8 = (char *)(pbVar3 + (ulong)pbVar3[1] + 2);
          goto LAB_0010da45;
        }
        if (-0x20 < ""[bVar1]) {
          lVar9 = lVar9 - lVar7;
          goto LAB_0010da45;
        }
        *ppcVar8 = (char *)pbVar3;
        mp_next_slowpath(ppcVar8,lVar9);
        bVar4 = false;
        lVar7 = lVar9;
      }
      else {
        *ppcVar8 = (char *)(pbVar3 + 1 + lVar7);
LAB_0010da45:
        bVar4 = true;
        lVar7 = lVar9;
      }
    } while ((bVar4) && (lVar9 = lVar7 + -1, 1 < lVar7));
    pcVar2 = (i->data).array.elem_end;
    (i->data).map.value = pcVar2;
    (i->data).map.value_end = pcVar2;
    ppcVar8 = &(i->data).map.value_end;
    lVar9 = 1;
    do {
      pbVar3 = (byte *)*ppcVar8;
      bVar1 = *pbVar3;
      *ppcVar8 = (char *)(pbVar3 + 1);
      lVar7 = (long)""[bVar1];
      if (lVar7 < 0) {
        if (bVar1 == 0xd9) {
          *ppcVar8 = (char *)(pbVar3 + (ulong)pbVar3[1] + 2);
          goto LAB_0010dad0;
        }
        if (-0x20 < ""[bVar1]) {
          lVar9 = lVar9 - lVar7;
          goto LAB_0010dad0;
        }
        *ppcVar8 = (char *)pbVar3;
        mp_next_slowpath(ppcVar8,lVar9);
        bVar4 = false;
        lVar7 = lVar9;
      }
      else {
        *ppcVar8 = (char *)(pbVar3 + 1 + lVar7);
LAB_0010dad0:
        bVar4 = true;
        lVar7 = lVar9;
      }
      iVar6 = 1;
    } while ((bVar4) && (lVar9 = lVar7 + -1, 1 < lVar7));
  }
  else {
    i->status = TNT_ITER_FAIL;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int tnt_iter_map_next(struct tnt_iter *i) {
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->pair_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->key = itr->first_key;
	else
		itr->key = itr->value_end;
	itr->key_end = itr->key;
	mp_next(&itr->key_end);
	itr->value = itr->key_end;
	itr->value_end = itr->value;
	mp_next(&itr->value_end);
	return 1;

}